

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_node * fy_alias_get_merge_mapping(fy_document *fyd,fy_node *fyn)

{
  fy_anchor *pfVar1;
  fy_node *pfVar2;
  
  if (((fyn != (fy_node *)0x0) && ((fyn->field_0x34 & 3) == 0)) && (fyn->style == FYNS_ALIAS)) {
    pfVar1 = fy_document_lookup_anchor_by_token(fyd,(fyn->field_12).scalar);
    if (pfVar1 == (fy_anchor *)0x0) {
      pfVar2 = (fy_node *)0x0;
    }
    else {
      pfVar2 = (fy_node *)0x0;
      if ((pfVar1->fyn->field_0x34 & 3) == 2) {
        pfVar2 = pfVar1->fyn;
      }
    }
    return pfVar2;
  }
  return (fy_node *)0x0;
}

Assistant:

static struct fy_node *fy_alias_get_merge_mapping(struct fy_document *fyd, struct fy_node *fyn) {
    struct fy_anchor *fya;

    /* must be an alias */
    if (!fy_node_is_alias(fyn))
        return NULL;

    /* anchor must exist */
    fya = fy_document_lookup_anchor_by_token(fyd, fyn->scalar);
    if (!fya)
        return NULL;

    /* and it must be a mapping */
    if (fya->fyn->type != FYNT_MAPPING)
        return NULL;

    return fya->fyn;
}